

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

void __thiscall
pbrt::ImageInfiniteLight::PDF_Le(ImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Float FVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  Tuple2<pbrt::Point2,_float> local_38;
  Tuple3<pbrt::Vector3,_float> local_30;
  undefined1 extraout_var [56];
  
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar3 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->super_LightBase).renderFromLight.mInv.m[0]
                                                  [1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][0]));
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->super_LightBase).renderFromLight.mInv.m[1]
                                                  [1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * (this->super_LightBase).renderFromLight.mInv.m[2]
                                                  [1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][0]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[0][2]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[1][2]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)fVar3),
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.mInv.m[2][2]));
  auVar4 = vinsertps_avx(auVar4,auVar7,0x1c);
  local_30.z = -auVar5._0_4_;
  auVar7._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
  auVar7._8_4_ = auVar4._8_4_ ^ 0x80000000;
  auVar7._12_4_ = auVar4._12_4_ ^ 0x80000000;
  local_30._0_8_ = vmovlps_avx(auVar7);
  auVar8._0_8_ = EqualAreaSphereToSquare((Vector3f *)&local_30);
  auVar8._8_56_ = extraout_var;
  local_38 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar8._0_16_);
  FVar6 = PiecewiseConstant2D::PDF(&this->distribution,(Point2f *)&local_38);
  *pdfDir = FVar6 / 12.566371;
  *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
  return;
}

Assistant:

void ImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    Vector3f wl = -renderFromLight.ApplyInverse(ray.d);
    Float mapPDF = distribution.PDF(EqualAreaSphereToSquare(wl));
    *pdfDir = mapPDF / (4 * Pi);
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
}